

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressreporter.cpp
# Opt level: O3

void __thiscall pbrt::ProgressReporter::~ProgressReporter(ProgressReporter *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  Done(this);
  if ((this->updateThread)._M_id._M_thread != 0) {
    std::terminate();
  }
  pcVar1 = (this->title)._M_dataplus._M_p;
  paVar2 = &(this->title).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

ProgressReporter::~ProgressReporter() {
    Done();
}